

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledPixel.cxx
# Opt level: O0

void __thiscall SSD1306::OledPixel::pixel(OledPixel *this,OledPoint p,PixelStyle style)

{
  undefined4 in_EDX;
  undefined8 in_RSI;
  long *in_RDI;
  
  switch(in_EDX) {
  case 0:
    (**(code **)(*in_RDI + 0x28))(in_RDI,in_RSI);
    break;
  case 1:
    (**(code **)(*in_RDI + 0x30))(in_RDI,in_RSI);
    break;
  case 2:
    (**(code **)(*in_RDI + 0x38))(in_RDI,in_RSI);
    break;
  case 3:
  }
  return;
}

Assistant:

void
SSD1306::OledPixel::pixel(
    SSD1306::OledPoint p,
    SSD1306::PixelStyle style)
{
    switch (style)
    {
    case PixelStyle::Set:

        setPixel(p);
        break;

    case PixelStyle::Unset:

        unsetPixel(p);
        break;

    case PixelStyle::Xor:

        xorPixel(p);
        break;

    case PixelStyle::None:

        break;
    }
}